

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

bool __thiscall
tst_InsertProxyModel::testCommitSubclass::InsertProxyModelCommit::validColumn
          (InsertProxyModelCommit *this)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  bool bVar7;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  QModelIndex local_48;
  
  lVar4 = QAbstractProxyModel::sourceModel();
  if (lVar4 == 0) {
    bVar7 = false;
  }
  else {
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    local_68._forAlignment = -NAN;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    uVar2 = (**(code **)(*plVar5 + 0x80))(plVar5,&local_68);
    plVar5 = (long *)QAbstractProxyModel::sourceModel();
    local_68._forAlignment = -NAN;
    local_68._8_8_ = 0;
    local_68._16_8_ = 0;
    iVar3 = (**(code **)(*plVar5 + 0x78))(plVar5,&local_68);
    iVar6 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
      iVar6 = 0;
    }
    do {
      bVar7 = iVar3 != iVar6;
      if (iVar3 == iVar6) {
        return bVar7;
      }
      local_80 = 0xffffffffffffffff;
      local_78 = 0;
      uStack_70 = 0;
      (**(code **)(*(long *)this + 0x60))(&local_48,this,iVar6,uVar2,&local_80);
      QModelIndex::data((QVariant *)&local_68,&local_48,0);
      bVar1 = QVariant::isValid((QVariant *)&local_68);
      QVariant::~QVariant((QVariant *)&local_68);
      iVar6 = iVar6 + 1;
    } while (!bVar1);
  }
  return bVar7;
}

Assistant:

bool validColumn() const Q_DECL_OVERRIDE
        {
            if (!sourceModel())
                return false;
            const int sourceCols = sourceModel()->columnCount();
            const int sourceRows = sourceModel()->rowCount();
            for (int i = 0; i < sourceRows; ++i) {
                if (index(i, sourceCols).data().isValid())
                    return true;
            }
            return false;
        }